

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O0

vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> __thiscall
sjtu::
BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
::range_query(BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
              *this,pair<unsigned_long_long,_int> *keyl,pair<unsigned_long_long,_int> *keyr)

{
  bool bVar1;
  vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> *extraout_RDX;
  vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> *extraout_RDX_00;
  vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> *extraout_RDX_01;
  vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> *pvVar2;
  vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> *extraout_RDX_02;
  vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> *extraout_RDX_03;
  int *in_RSI;
  pair<const_std::pair<unsigned_long_long,_int>,_long> *in_RDI;
  vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> vVar3;
  int j;
  int i;
  node *x;
  locType pos;
  vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> *ret;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> *in_stack_ffffffffffffff50;
  byte local_a3;
  bool local_a1;
  pair<std::pair<unsigned_long_long,_int>,_long> local_80;
  pair<const_std::pair<unsigned_long_long,_int>,_long> local_68;
  int local_40;
  int local_3c;
  vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> *local_38;
  pair<const_std::pair<unsigned_long_long,_int>,_long> *local_30;
  undefined1 local_21;
  
  local_21 = 0;
  vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_>::vector
            (in_stack_ffffffffffffff50);
  pvVar2 = extraout_RDX;
  if (*in_RSI == 0) {
LAB_0011cc87:
    vVar3._8_8_ = pvVar2;
    vVar3.data = in_RDI;
    return vVar3;
  }
  local_30 = *(pair<const_std::pair<unsigned_long_long,_int>,_long> **)(in_RSI + 2);
  for (local_3c = 0; local_3c < *in_RSI; local_3c = local_3c + 1) {
    local_38 = (vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> *)
               (**(code **)(**(long **)(in_RSI + 4) + 0x10))(*(long **)(in_RSI + 4),&local_30);
    local_40 = 0;
    while( true ) {
      local_a1 = false;
      pvVar2 = local_38;
      if (local_40 < local_38[0x95].currentLength) {
        local_a1 = std::less<std::pair<unsigned_long_long,_int>_>::operator()
                             ((less<std::pair<unsigned_long_long,_int>_> *)in_stack_ffffffffffffff50
                              ,(pair<unsigned_long_long,_int> *)
                               CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                              (pair<unsigned_long_long,_int> *)0x11ca65);
        pvVar2 = extraout_RDX_00;
      }
      if (local_a1 == false) break;
      local_40 = local_40 + 1;
    }
    if (local_3c < *in_RSI + -1) {
      local_a3 = 0;
      pvVar2 = local_38;
      if (local_40 < local_38[0x95].currentLength) {
        bVar1 = std::less<std::pair<unsigned_long_long,_int>_>::operator()
                          ((less<std::pair<unsigned_long_long,_int>_> *)in_stack_ffffffffffffff50,
                           (pair<unsigned_long_long,_int> *)
                           CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                           (pair<unsigned_long_long,_int> *)0x11cb06);
        local_a3 = bVar1 ^ 0xff;
        pvVar2 = extraout_RDX_01;
      }
      if ((local_a3 & 1) == 0) {
        local_30 = (&local_38->data)[local_40];
      }
      else {
        local_30 = (&local_38->data)[local_40 + 1];
      }
    }
  }
  do {
    if (local_40 == local_38[0x95].currentLength) {
      if (local_38[0x32].data ==
          (pair<const_std::pair<unsigned_long_long,_int>,_long> *)0xffffffffffffffff)
      goto LAB_0011cc87;
      in_stack_ffffffffffffff50 =
           (vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> *)
           (**(code **)(**(long **)(in_RSI + 4) + 0x10))(*(long **)(in_RSI + 4),local_38 + 0x32);
      local_40 = 0;
      local_38 = in_stack_ffffffffffffff50;
    }
    in_stack_ffffffffffffff4f =
         std::less<std::pair<unsigned_long_long,_int>_>::operator()
                   ((less<std::pair<unsigned_long_long,_int>_> *)in_stack_ffffffffffffff50,
                    (pair<unsigned_long_long,_int> *)
                    CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                    (pair<unsigned_long_long,_int> *)0x11cc04);
    pvVar2 = extraout_RDX_02;
    if ((bool)in_stack_ffffffffffffff4f) goto LAB_0011cc87;
    std::make_pair<std::pair<unsigned_long_long,int>&,long&>
              ((pair<unsigned_long_long,_int> *)in_stack_ffffffffffffff50,
               (long *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    std::pair<const_std::pair<unsigned_long_long,_int>,_long>::
    pair<std::pair<unsigned_long_long,_int>,_long,_true>(&local_68,&local_80);
    vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_>::push_back
              (in_stack_ffffffffffffff50,
               (pair<const_std::pair<unsigned_long_long,_int>,_long> *)
               CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    local_40 = local_40 + 1;
    pvVar2 = extraout_RDX_03;
  } while( true );
}

Assistant:

vector<value_type> range_query(const Key &keyl, const Key &keyr) {
            vector<value_type> ret;
            if (!depth)return ret;
            locType pos = root;
            node *x;
            int i, j;
            for (i = 0; i < depth; ++i) {
                x = file->read(pos);
                for (j = 0; j < x->sz && Compare()(x->keyvalue[j], keyl); ++j);
                if (i < depth - 1) {
                    if (j < x->sz && !Compare()(keyl, x->keyvalue[j]))pos = x->pointer[j + 1];
                    else pos = x->pointer[j];
                }
            }
            while (1) {
                if (j == x->sz) {
                    if (x->nxt == -1)break;
                    x = file->read(x->nxt);
                    j = 0;
                }
                if (Compare()(keyr, x->keyvalue[j]))break;
                ret.push_back(std::make_pair(x->keyvalue[j], x->val[j]));
                ++j;
            }
            return ret;
        }